

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<bool>,duckdb::HistogramBinFunction>
               (HistogramBinState<bool> *source,HistogramBinState<bool> *target,
               AggregateInputData *input_data)

{
  _Bit_iterator *p_Var1;
  unsafe_vector<bool> *puVar2;
  unsafe_vector<bool> *puVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  bool bVar11;
  vector<bool,_std::allocator<bool>_> *this;
  unsafe_vector<idx_t> *puVar12;
  NotImplementedException *this_00;
  InternalException *this_01;
  long lVar13;
  long lVar14;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __first2;
  string local_48;
  
  puVar2 = source->bin_boundaries;
  if (puVar2 == (unsafe_vector<bool> *)0x0) {
    return;
  }
  puVar3 = target->bin_boundaries;
  if (puVar3 == (unsafe_vector<bool> *)0x0) {
    this = (vector<bool,_std::allocator<bool>_> *)operator_new(0x28);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    *(undefined8 *)(this + 0x20) = 0;
    target->bin_boundaries = (unsafe_vector<bool> *)this;
    puVar12 = (unsafe_vector<idx_t> *)operator_new(0x18);
    (puVar12->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (puVar12->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (puVar12->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    target->counts = puVar12;
    ::std::vector<bool,_std::allocator<bool>_>::operator=
              (this,&source->bin_boundaries->super_vector<bool,_std::allocator<bool>_>);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)target->counts,
               &source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    return;
  }
  uVar4 = *(ulong *)&(puVar3->super_vector<bool,_std::allocator<bool>_>).
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base;
  p_Var1 = &(puVar3->super_vector<bool,_std::allocator<bool>_>).
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
  uVar9 = (p_Var1->super__Bit_iterator_base)._M_p;
  uVar10 = (p_Var1->super__Bit_iterator_base)._M_offset;
  __last1.super__Bit_iterator_base._M_offset = uVar10;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)uVar9;
  uVar5 = *(ulong *)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base;
  if (((ulong)*(uint *)((long)&(puVar3->super_vector<bool,_std::allocator<bool>_>).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) +
       ((long)(p_Var1->super__Bit_iterator_base)._M_p - uVar4) * 8 !=
       (ulong)*(uint *)((long)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) +
       ((long)(puVar2->super_vector<bool,_std::allocator<bool>_>).
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
              super__Bit_iterator_base._M_p - uVar5) * 8) ||
     (__first1.super__Bit_iterator_base._8_8_ = 0,
     __first1.super__Bit_iterator_base._M_p = (_Bit_type *)uVar4,
     __last1.super__Bit_iterator_base._12_4_ = 0, __first2.super__Bit_iterator_base._8_8_ = 0,
     __first2.super__Bit_iterator_base._M_p = (_Bit_type *)uVar5,
     bVar11 = ::std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                        (__first1,__last1,__first2), !bVar11)) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
               ,"");
    NotImplementedException::NotImplementedException(this_00,&local_48);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  puVar6 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar13 = (long)puVar7 - (long)puVar6;
  puVar8 = (source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar13 != (long)(source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar8) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "Histogram combine - bin boundaries are the same but counts are different","");
    InternalException::InternalException(this_01,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (puVar7 == puVar6) {
    return;
  }
  lVar13 = lVar13 >> 3;
  lVar14 = 0;
  do {
    puVar6[lVar14] = puVar6[lVar14] + puVar8[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}